

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O1

Var Js::JavascriptReflect::EntryGetOwnPropertyDescriptor
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  Entry *pEVar9;
  Type TVar10;
  int32 hCode;
  int in_stack_00000010;
  Type local_98;
  Type TStack_90;
  undefined1 local_88 [8];
  AutoTagNativeLibraryEntry __tag;
  Var result;
  CallInfo local_50;
  CallInfo callInfo_local;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_50._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x70,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d107c6;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_40 = (undefined1  [8])local_50;
  ArgumentReader::AdjustArguments((ArgumentReader *)auStack_40,&local_50);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  callInfo_local =
       (CallInfo)
       (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_88,function,local_50,
             L"Reflect.getOwnPropertyDescriptor",&stack0x00000000);
  if (((ulong)auStack_40 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x75,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) goto LAB_00d107c6;
    *puVar6 = 0;
  }
  if ((auStack_40._0_4_ >> 0x18 & 1) != 0) {
    hCode = -0x7ff5ebf5;
LAB_00d107ce:
    JavascriptError::ThrowTypeError(pSVar1,hCode,L"Reflect.getOwnPropertyDescriptor");
  }
  hCode = -0x7ff5ec36;
  if (((ulong)auStack_40 & 0xfffffe) == 0) goto LAB_00d107ce;
  pvVar7 = Arguments::operator[]((Arguments *)auStack_40,1);
  BVar4 = JavascriptOperators::IsObject(pvVar7);
  if (BVar4 == 0) goto LAB_00d107ce;
  pvVar7 = Arguments::operator[]((Arguments *)auStack_40,1);
  if (2 < (auStack_40._0_4_ & 0xffffff)) {
    callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)auStack_40,2);
  }
  if (pvVar7 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d107c6;
    *puVar6 = 0;
  }
  if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d107c6;
    *puVar6 = 0;
  }
  TVar10 = TypeIds_FirstNumberType;
  if ((((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar10 = TypeIds_Number, (ulong)pvVar7 >> 0x32 == 0)) {
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d107c6;
      *puVar6 = 0;
    }
    TVar10 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar4 = RecyclableObject::IsExternal(pRVar8), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00d107c6:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  if (TVar10 == TypeIds_HostDispatch) {
    pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
    local_98._0_4_ = auStack_40._0_4_;
    local_98._4_4_ = auStack_40._4_4_;
    TStack_90._0_4_ = args.super_Arguments.Info._0_4_;
    TStack_90._4_4_ = args.super_Arguments.Info._4_4_;
    iVar5 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])
                      (pRVar8,EntryGetOwnPropertyDescriptor,&local_98,&__tag.entry.next);
    pEVar9 = __tag.entry.next;
    if (iVar5 != 0) goto LAB_00d107ab;
  }
  pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
  pEVar9 = (Entry *)JavascriptObject::GetOwnPropertyDescriptorHelper
                              (pRVar8,(Var)callInfo_local,pSVar1);
LAB_00d107ab:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_88);
  return pEVar9;
}

Assistant:

Var JavascriptReflect::EntryGetOwnPropertyDescriptor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.getOwnPropertyDescriptor"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.getOwnPropertyDescriptor"));
        }

        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.getOwnPropertyDescriptor"));
        }
        Var target = args[1];
        Var propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;

        if (JavascriptOperators::GetTypeId(target) == TypeIds_HostDispatch)
        {
            Var result;
            if (VarTo<RecyclableObject>(target)->InvokeBuiltInOperationRemotely(EntryGetOwnPropertyDescriptor, args, &result))
            {
                return result;
            }
        }

        return JavascriptObject::GetOwnPropertyDescriptorHelper(VarTo<RecyclableObject>(target), propertyKey, scriptContext);
    }